

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatfoe.c
# Opt level: O1

int ecx_FOEwrite(ecx_contextt *context,uint16 slave,char *filename,uint32 password,int psize,void *p
                ,int timeout)

{
  bool bVar1;
  uint8 uVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  undefined6 in_register_00000032;
  uint uVar8;
  ulong __n;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  uint32 local_864;
  uint local_860;
  void *local_858;
  short local_838;
  uint8 local_836 [3];
  byte local_833;
  uint8 local_832;
  uint32 local_830;
  undefined1 local_82c [1012];
  uint8 local_438 [5];
  byte local_433;
  uint8 local_432;
  uint32 local_430;
  
  ec_clearmbx((ec_mbxbuft *)local_438);
  local_864 = 0;
  ecx_mbxreceive(context,slave,(ec_mbxbuft *)local_438,0);
  ec_clearmbx((ec_mbxbuft *)&local_838);
  sVar4 = strlen(filename);
  uVar6 = CONCAT62(in_register_00000032,slave) & 0xffffffff;
  uVar8 = context->slavelist[uVar6].mbx_l - 0xc;
  uVar7 = uVar8 & 0xffff;
  if (((uint)sVar4 & 0xffff) <= uVar7) {
    uVar8 = (uint)sVar4;
  }
  local_838 = (short)uVar8 + 6;
  local_836[0] = '\0';
  local_836[1] = '\0';
  local_836[2] = '\0';
  uVar2 = ec_nextmbxcnt(context->slavelist[uVar6].mbx_cnt);
  context->slavelist[uVar6].mbx_cnt = uVar2;
  local_833 = uVar2 << 4 | 4;
  local_832 = '\x02';
  __n = (ulong)(uVar8 & 0xffff);
  local_830 = password;
  memcpy(local_82c,filename,__n);
  iVar3 = ecx_mbxsend(context,slave,(ec_mbxbuft *)&local_838,20000);
  if (0 < iVar3) {
    bVar5 = false;
    local_860 = psize;
    local_858 = p;
    do {
      ec_clearmbx((ec_mbxbuft *)local_438);
      iVar3 = ecx_mbxreceive(context,slave,(ec_mbxbuft *)local_438,timeout);
      bVar1 = true;
      if (0 < iVar3) {
        if ((local_433 & 0xf) == 4) {
          if (local_432 == '\x06') {
            if (local_864 == 0) {
              local_864 = 0;
            }
            else {
              if (local_860 == 0) {
                bVar5 = true;
              }
              local_860 = local_860 + (int)__n;
              local_858 = (void *)((long)local_858 - (long)(int)__n);
              local_864 = local_864 - 1;
            }
          }
          else if (local_432 == '\x05') {
            iVar3 = -5;
          }
          else {
            if (local_432 != '\x04') goto LAB_0010a0b7;
            if (local_430 == local_864) {
              if (context->FOEhook != (_func_int_uint16_int_int *)0x0) {
                (*context->FOEhook)(slave,local_430,local_860);
              }
              uVar8 = uVar7;
              if ((int)local_860 < (int)uVar7) {
                uVar8 = local_860;
              }
              if ((uVar8 != 0) || (bVar5)) {
                bVar5 = (int)uVar7 <= (int)local_860 && local_860 - uVar8 == 0;
                local_838 = (short)uVar8 + 6;
                local_836[0] = '\0';
                local_836[1] = '\0';
                local_836[2] = '\0';
                uVar2 = ec_nextmbxcnt(context->slavelist[uVar6].mbx_cnt);
                context->slavelist[uVar6].mbx_cnt = uVar2;
                local_833 = uVar2 << 4 | 4;
                local_832 = '\x03';
                local_864 = local_864 + 1;
                local_830 = local_864;
                memcpy(local_82c,local_858,(long)(int)uVar8);
                local_858 = (void *)((long)local_858 + (long)(int)uVar8);
                iVar3 = ecx_mbxsend(context,slave,(ec_mbxbuft *)&local_838,20000);
                bVar1 = iVar3 < 1;
                __n = (ulong)uVar8;
                local_860 = local_860 - uVar8;
              }
            }
            else {
              iVar3 = -7;
            }
          }
        }
        else {
LAB_0010a0b7:
          iVar3 = -3;
        }
      }
    } while (!bVar1);
  }
  return iVar3;
}

Assistant:

int ecx_FOEwrite(ecx_contextt *context, uint16 slave, char *filename, uint32 password, int psize, void *p, int timeout)
{
   ec_FOEt *FOEp, *aFOEp;
   int wkc;
   int32 packetnumber, sendpacket = 0;
   uint16 fnsize, maxdata;
   int segmentdata;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;
   boolean worktodo, dofinalzero;
   int tsize;

   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aFOEp = (ec_FOEt *)&MbxIn;
   FOEp = (ec_FOEt *)&MbxOut;
   dofinalzero = FALSE;
   fnsize = strlen(filename);
   maxdata = context->slavelist[slave].mbx_l - 12;
   if (fnsize > maxdata)
   {
      fnsize = maxdata;
   }
   FOEp->MbxHeader.length = htoes(0x0006 + fnsize);
   FOEp->MbxHeader.address = htoes(0x0000);
   FOEp->MbxHeader.priority = 0x00;
   /* get new mailbox count value, used as session handle */
   cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
   context->slavelist[slave].mbx_cnt = cnt;
   FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
   FOEp->OpCode = ECT_FOE_WRITE;
   FOEp->Password = htoel(password);
   /* copy filename in mailbox */
   memcpy(&FOEp->FileName[0], filename, fnsize);
   /* send FoE request to slave */
   wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
   if (wkc > 0) /* succeeded to place mailbox in slave ? */
   {
      do
      {   
         worktodo = FALSE;
         /* clean mailboxbuffer */
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, timeout);
         if (wkc > 0) /* succeeded to read slave response ? */
         {
            /* slave response should be FoE */
            if ((aFOEp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_FOE)
            {
               switch (aFOEp->OpCode)
               {
                  case ECT_FOE_ACK:
                  {
                     packetnumber = etohl(aFOEp->PacketNumber);
                     if (packetnumber == sendpacket)
                     {
                        if (context->FOEhook)
                        {
                           context->FOEhook(slave, packetnumber, psize);
                        }
                        tsize = psize;
                        if (tsize > maxdata)
                        {
                           tsize = maxdata;
                        }
                        if(tsize || dofinalzero)
                        {
                           worktodo = TRUE; 
                           dofinalzero = FALSE;
                           segmentdata = tsize;
                           psize -= segmentdata;
                           /* if last packet was full size, add a zero size packet as final */
                           /* EOF is defined as packetsize < full packetsize */
                           if (!psize && (segmentdata == maxdata))
                           {
                              dofinalzero = TRUE;
                           }
                           FOEp->MbxHeader.length = htoes(0x0006 + segmentdata);
                           FOEp->MbxHeader.address = htoes(0x0000);
                           FOEp->MbxHeader.priority = 0x00;
                           /* get new mailbox count value */
                           cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
                           context->slavelist[slave].mbx_cnt = cnt;
                           FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
                           FOEp->OpCode = ECT_FOE_DATA;
                           sendpacket++;
                           FOEp->PacketNumber = htoel(sendpacket);
                           memcpy(&FOEp->Data[0], p, segmentdata);
                           p = (uint8 *)p + segmentdata;
                           /* send FoE data to slave */
                           wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
                           if (wkc <= 0)
                           {   
                              worktodo = FALSE;
                           }
                        }
                     }
                     else
                     {
                        /* FoE error */
                        wkc = -EC_ERR_TYPE_FOE_PACKETNUMBER;
                     }
                     break;
                  }
                  case ECT_FOE_BUSY:
                  {
                     /* resend if data has been send before */
                     /* otherwise ignore */
                     if (sendpacket)
                     {
                        if (!psize)
                        {
                           dofinalzero = TRUE;
                        }
                        psize += segmentdata;
                        p = (uint8 *)p - segmentdata;
                        --sendpacket;
                     }
                     break;
                  }
                  case ECT_FOE_ERROR:
                  {
                     /* FoE error */
                     wkc = -EC_ERR_TYPE_FOE_ERROR;
                     break;
                  }
                  default:
                  {
                     /* unexpected mailbox received */
                     wkc = -EC_ERR_TYPE_PACKET_ERROR;
                  }
               }
            }
            else
            {
               /* unexpected mailbox received */
               wkc = -EC_ERR_TYPE_PACKET_ERROR;
            }
         }
      } while (worktodo);   
   }
   
   return wkc;
}